

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

void EVdelayed_submit_func(CManager cm,void *vdelayed)

{
  int iVar1;
  event_item *event;
  
  iVar1 = *vdelayed;
  event = *(event_item **)((long)vdelayed + 8);
  free(vdelayed);
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                   ,0x64a);
  internal_path_submit(cm,iVar1,event);
  do_local_actions(cm);
  return_event(cm->evp,event);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                     ,0x64e);
  return;
}

Assistant:

static void
EVdelayed_submit_func(CManager cm, void* vdelayed)
{
    struct delayed_event *delayed = (struct delayed_event *)vdelayed;
    int stone_num = delayed->to_stone;
    event_item *event = delayed->event;
    free(delayed);
    CManager_lock(cm);
    internal_path_submit(cm, stone_num, event);
    do_local_actions(cm);
    return_event(cm->evp, event);
    CManager_unlock(cm);
}